

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fork.cpp
# Opt level: O1

int main(void)

{
  char cVar1;
  __pid_t _Var2;
  int iVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  fork_shared_mutex mutex_;
  int fd [2];
  ostringstream oss;
  fork_shared_mutex local_1d0 [8];
  int local_1c8;
  int local_1c4;
  string local_1c0 [32];
  ushort local_1a0 [188];
  
  booster::fork_shared_mutex::fork_shared_mutex(local_1d0);
  pipe(&local_1c8);
  _Var2 = fork();
  if (_Var2 == 0) {
    close(local_1c4);
    iVar3 = doread(local_1c8);
    if (iVar3 != 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_fork.cpp"
                 ,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x46);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," doread(fd[0])==1",0x11);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_1c0);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    cVar1 = booster::fork_shared_mutex::try_unique_lock();
    if (cVar1 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_fork.cpp"
                 ,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x47);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," mutex_.try_lock()",0x12);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_1c0);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar3 = doread(local_1c8);
    if (iVar3 != 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_fork.cpp"
                 ,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x48);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," doread(fd[0])==1",0x11);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_1c0);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    booster::fork_shared_mutex::unlock();
    iVar3 = doread(local_1c8);
    if (iVar3 != 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_fork.cpp"
                 ,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x4b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," doread(fd[0])==1",0x11);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_1c0);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    cVar1 = booster::fork_shared_mutex::try_shared_lock();
    if (cVar1 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_fork.cpp"
                 ,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x4c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," mutex_.try_shared_lock()",0x19);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_1c0);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    booster::fork_shared_mutex::unlock();
    cVar1 = booster::fork_shared_mutex::try_unique_lock();
    if (cVar1 != '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_fork.cpp"
                 ,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x4e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," !mutex_.try_unique_lock()",0x1a);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_1c0);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    booster::fork_shared_mutex::unique_lock();
    iVar3 = doread(local_1c8);
    if (iVar3 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_fork.cpp"
                 ,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x50);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," doread(fd[0])==0",0x11);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_1c0);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar3 = 0;
    usleep(200000);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test try_lock",0xd);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    close(local_1c8);
    usleep(100000);
    dowrite(local_1c4);
    usleep(100000);
    cVar1 = booster::fork_shared_mutex::try_unique_lock();
    if (cVar1 != '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_fork.cpp"
                 ,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x33);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," !mutex_.try_lock()",0x13);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_1c0);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    dowrite(local_1c4);
    usleep(100000);
    cVar1 = booster::fork_shared_mutex::try_unique_lock();
    if (cVar1 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_fork.cpp"
                 ,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x36);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," mutex_.try_lock()",0x12);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_1c0);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    booster::fork_shared_mutex::unlock();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Test shared/unique",0x12);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    booster::fork_shared_mutex::shared_lock();
    dowrite(local_1c4);
    usleep(100000);
    close(local_1c4);
    booster::fork_shared_mutex::unlock();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Test unlock on exit",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    usleep(100000);
    cVar1 = booster::fork_shared_mutex::try_unique_lock();
    if (cVar1 != '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_fork.cpp"
                 ,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x40);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," !mutex_.try_lock()",0x13);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_1c0);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    usleep(500000);
    cVar1 = booster::fork_shared_mutex::try_unique_lock();
    if (cVar1 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_fork.cpp"
                 ,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,0x42);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," mutex_.try_lock()",0x12);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_1c0);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    wait(local_1a0);
    iVar3 = 1;
    if ((local_1a0[0] & 0xff7f) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Ok",2);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
      std::ostream::put('h');
      iVar3 = 0;
      std::ostream::flush();
    }
  }
  booster::fork_shared_mutex::~fork_shared_mutex(local_1d0);
  return iVar3;
}

Assistant:

int main()
{
	booster::fork_shared_mutex mutex_;
	int fd[2];
	int res =  pipe(fd);
	(void)(res);
	int pid = fork();
	try {
		if(pid!=0) { // parent

			std::cout << "Test try_lock" << std::endl;
			close(fd[0]);
			usleep(100000);
			dowrite(fd[1]);
			usleep(100000);
			TEST(!mutex_.try_lock());
			dowrite(fd[1]);
			usleep(100000);
			TEST(mutex_.try_lock());
			mutex_.unlock();
			std::cout << "Test shared/unique" << std::endl;
			mutex_.shared_lock();
			dowrite(fd[1]);
			usleep(100000);
			close(fd[1]);
			mutex_.unlock();
			std::cout << "Test unlock on exit" << std::endl;
			usleep(100000);
			TEST(!mutex_.try_lock());
			usleep(500000);
			TEST(mutex_.try_lock());
		}
		else { // child
			close(fd[1]);
			TEST(doread(fd[0])==1);
			TEST(mutex_.try_lock());
			TEST(doread(fd[0])==1);
			mutex_.unlock();
			// test 2
			TEST(doread(fd[0])==1);
			TEST(mutex_.try_shared_lock());
			mutex_.unlock();
			TEST(!mutex_.try_unique_lock());
			mutex_.unique_lock();
			TEST(doread(fd[0])==0);
			usleep(200000);
			return 0;
		}
	}
	catch(std::exception const &e) {
		std::cerr << e.what() << std::endl;
		if(pid!=0) {
			int res;
			::wait(&res);
		}
		return 1;
	}
	if(pid!=0) {
		int res;
		::wait(&res);
		if(WIFEXITED(res) && WEXITSTATUS(res)==0) {
			std::cerr << "Ok" <<std::endl;
			return 0;
		}
		return 1;
	}
	return 0;
}